

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O3

void anon_unknown.dwarf_2d7a6a::writeRead
               (string *tempDir,Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,
               Array2D<float> *pf,int W,int H,LineOrder lorder,Compression comp,
               LevelRoundingMode rmode,int dx,int dy,int xSize,int ySize)

{
  undefined4 in_register_00000084;
  Array2D<float> *pf1;
  LevelMode in_stack_ffffffffffffffa8;
  string filename;
  
  pf1 = (Array2D<float> *)CONCAT44(in_register_00000084,W);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,tempDir,(long)&(tempDir->_M_dataplus)._M_p + (long)&pi->_sizeX);
  std::__cxx11::string::append((char *)&filename);
  writeRead((Array2D<unsigned_int> *)ph,(Array2D<Imath_3_2::half> *)pf,pf1,filename._M_dataplus._M_p
            ,H,dx,dy,comp,rmode,0,lorder,NO_COMPRESSION,in_stack_ffffffffffffffa8,
            (LevelRoundingMode)filename._M_dataplus._M_p,(bool)(undefined1)filename._M_string_length
           );
  writeRead((Array2D<unsigned_int> *)ph,(Array2D<Imath_3_2::half> *)pf,pf1,filename._M_dataplus._M_p
            ,H,dx,dy,comp,rmode,1,lorder,NO_COMPRESSION,in_stack_ffffffffffffffa8,
            (LevelRoundingMode)filename._M_dataplus._M_p,(bool)(undefined1)filename._M_string_length
           );
  writeRead((Array2D<unsigned_int> *)ph,(Array2D<Imath_3_2::half> *)pf,pf1,filename._M_dataplus._M_p
            ,H,dx,dy,comp,rmode,2,lorder,NO_COMPRESSION,in_stack_ffffffffffffffa8,
            (LevelRoundingMode)filename._M_dataplus._M_p,(bool)(undefined1)filename._M_string_length
           );
  writeRead((Array2D<unsigned_int> *)ph,(Array2D<Imath_3_2::half> *)pf,pf1,filename._M_dataplus._M_p
            ,H,dx,dy,comp,rmode,0,lorder,RLE_COMPRESSION,in_stack_ffffffffffffffa8,
            (LevelRoundingMode)filename._M_dataplus._M_p,(bool)(undefined1)filename._M_string_length
           );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
writeRead (
    const std::string&           tempDir,
    const Array2D<unsigned int>& pi,
    const Array2D<half>&         ph,
    const Array2D<float>&        pf,
    int                          W,
    int                          H,
    LineOrder                    lorder,
    Compression                  comp,
    LevelRoundingMode            rmode,
    int                          dx,
    int                          dy,
    int                          xSize,
    int                          ySize)
{
    std::string filename = tempDir + "imf_test_scanline_api.exr";

    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        ONE_LEVEL,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        MIPMAP_LEVELS,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        RIPMAP_LEVELS,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        ONE_LEVEL,
        rmode,
        true);
}